

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O2

int get_zeros_padding(uchar *input,size_t input_len,size_t *data_len)

{
  int iVar1;
  ulong uVar2;
  size_t sVar3;
  byte bVar4;
  byte bVar5;
  
  iVar1 = -0x6100;
  if (data_len != (size_t *)0x0 && input != (uchar *)0x0) {
    *data_len = 0;
    iVar1 = 0;
    uVar2 = 0;
    bVar5 = 0;
    while (sVar3 = input_len - 1, input_len != 0) {
      bVar4 = input[input_len - 1] != '\0' | bVar5;
      if (bVar4 == bVar5) {
        input_len = 0;
      }
      uVar2 = uVar2 | input_len;
      *data_len = uVar2;
      input_len = sVar3;
      bVar5 = bVar4;
    }
  }
  return iVar1;
}

Assistant:

static int get_zeros_padding( unsigned char *input, size_t input_len,
                              size_t *data_len )
{
    size_t i;
    unsigned char done = 0, prev_done;

    if( NULL == input || NULL == data_len )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

    *data_len = 0;
    for( i = input_len; i > 0; i-- )
    {
        prev_done = done;
        done |= ( input[i-1] != 0 );
        *data_len |= i * ( done != prev_done );
    }

    return( 0 );
}